

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcBSplineCurve>
                 (DB *db,LIST *params,IfcBSplineCurve *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_358;
  long local_330;
  long local_308;
  long local_2e0;
  long local_2b8;
  TypeError *t_4;
  undefined1 local_238 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_4;
  TypeError *t_3;
  undefined1 local_1c8 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_3;
  TypeError *t_2;
  undefined1 local_158 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_2;
  TypeError *t_1;
  undefined1 local_e8 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  reference local_80;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcBSplineCurve *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcBSplineCurve *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                       (db,params,&in->super_IfcBoundedCurve);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (4 < sVar1) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_70);
    if (peVar2 == (element_type *)0x0) {
      local_2b8 = 0;
    }
    else {
      local_2b8 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0
                                );
    }
    if (local_2b8 == 0) {
      GenericConvert<long>
                ((long *)(base + 0x50),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70
                 ,(DB *)params_local);
    }
    else {
      std::bitset<5UL>::operator[]((bitset<5UL> *)&local_80,base + 0x48);
      std::bitset<5UL>::reference::operator=(&local_80,true);
      std::bitset<5UL>::reference::~reference(&local_80);
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_e8,(size_t)in_local);
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_e8);
    if (peVar2 == (element_type *)0x0) {
      local_2e0 = 0;
    }
    else {
      local_2e0 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0
                                );
    }
    if (local_2e0 == 0) {
      GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,2ul,0ul>
                ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_2UL,_0UL> *
                 )(base + 0x58),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_e8,
                 (DB *)params_local);
    }
    else {
      std::bitset<5UL>::operator[]((bitset<5UL> *)&t_1,base + 0x48);
      std::bitset<5UL>::reference::operator=((reference *)&t_1,true);
      std::bitset<5UL>::reference::~reference((reference *)&t_1);
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_e8);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_158,(size_t)in_local);
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_158);
    if (peVar2 == (element_type *)0x0) {
      local_308 = 0;
    }
    else {
      local_308 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0
                                );
    }
    if (local_308 == 0) {
      GenericConvert<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(base + 0x70),
                 (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_158,(DB *)params_local);
    }
    else {
      std::bitset<5UL>::operator[]((bitset<5UL> *)&t_2,base + 0x48);
      std::bitset<5UL>::reference::operator=((reference *)&t_2,true);
      std::bitset<5UL>::reference::~reference((reference *)&t_2);
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_158);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_1c8,(size_t)in_local);
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_1c8);
    if (peVar2 == (element_type *)0x0) {
      local_330 = 0;
    }
    else {
      local_330 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0
                                );
    }
    if (local_330 == 0) {
      GenericConvert<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
                ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)(base + 0x90),
                 (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_1c8,(DB *)params_local);
    }
    else {
      std::bitset<5UL>::operator[]((bitset<5UL> *)&t_3,base + 0x48);
      std::bitset<5UL>::reference::operator=((reference *)&t_3,true);
      std::bitset<5UL>::reference::~reference((reference *)&t_3);
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_1c8);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_238,(size_t)in_local);
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_238);
    if (peVar2 == (element_type *)0x0) {
      local_358 = 0;
    }
    else {
      local_358 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0
                                );
    }
    if (local_358 == 0) {
      GenericConvert<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
                ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)(base + 0xa0),
                 (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_238,(DB *)params_local);
    }
    else {
      std::bitset<5UL>::operator[]((bitset<5UL> *)&t_4,base + 0x48);
      std::bitset<5UL>::reference::operator=((reference *)&t_4,true);
      std::bitset<5UL>::reference::~reference((reference *)&t_4);
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_238);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"expected 5 arguments to IfcBSplineCurve",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcBSplineCurve>(const DB& db, const LIST& params, IfcBSplineCurve* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcBoundedCurve*>(in));
	if (params.GetSize() < 5) { throw STEP::TypeError("expected 5 arguments to IfcBSplineCurve"); }    do { // convert the 'Degree' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,5>::aux_is_derived[0]=true; break; }
        try { GenericConvert( in->Degree, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcBSplineCurve to be a `INTEGER`")); }
    } while(0);
    do { // convert the 'ControlPointsList' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,5>::aux_is_derived[1]=true; break; }
        try { GenericConvert( in->ControlPointsList, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcBSplineCurve to be a `LIST [2:?] OF IfcCartesianPoint`")); }
    } while(0);
    do { // convert the 'CurveForm' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,5>::aux_is_derived[2]=true; break; }
        try { GenericConvert( in->CurveForm, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 2 to IfcBSplineCurve to be a `IfcBSplineCurveForm`")); }
    } while(0);
    do { // convert the 'ClosedCurve' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,5>::aux_is_derived[3]=true; break; }
        try { GenericConvert( in->ClosedCurve, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 3 to IfcBSplineCurve to be a `LOGICAL`")); }
    } while(0);
    do { // convert the 'SelfIntersect' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,5>::aux_is_derived[4]=true; break; }
        try { GenericConvert( in->SelfIntersect, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcBSplineCurve to be a `LOGICAL`")); }
    } while(0);
	return base;
}